

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O3

void __thiscall ThreadContext::PostSweepRedeferralCallBack(ThreadContext *this)

{
  bool bVar1;
  AutoHandledExceptionType local_21 [8];
  AutoHandledExceptionType __autoHandledExceptionType;
  
  bVar1 = DoTryRedeferral(this);
  if (bVar1) {
    AutoHandledExceptionType::AutoHandledExceptionType(local_21,ExceptionType_OutOfMemory);
    TryRedeferral(this);
    AutoHandledExceptionType::~AutoHandledExceptionType(local_21);
  }
  UpdateRedeferralState(this);
  return;
}

Assistant:

void
ThreadContext::PostSweepRedeferralCallBack()
{
    if (this->DoTryRedeferral())
    {
        HRESULT hr = S_OK;
        BEGIN_TRANSLATE_OOM_TO_HRESULT
        {
            this->TryRedeferral();
        }
        END_TRANSLATE_OOM_TO_HRESULT(hr);
    }